

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::pattern_formatter::handle_flag_<spdlog::details::scoped_padder>
          (pattern_formatter *this,char flag,padding_info padding)

{
  pointer __p;
  flag_formatter *pfVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  size_t sVar4;
  undefined7 in_register_00000031;
  char cVar5;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_30;
  _Head_base<0UL,_spdlog::details::flag_formatter_*,_false> local_28;
  
  uVar3 = padding._8_8_;
  sVar4 = padding.width_;
  switch((int)CONCAT71(in_register_00000031,flag)) {
  case 0x21:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d9f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  default:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x38);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)0x0;
    ((local_30._M_head_impl)->padinfo_).width_ = 0;
    ((local_30._M_head_impl)->padinfo_).side_ = left;
    ((local_30._M_head_impl)->padinfo_).truncate_ = false;
    ((local_30._M_head_impl)->padinfo_).enabled_ = false;
    *(undefined2 *)&((local_30._M_head_impl)->padinfo_).field_0xe = 0;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_30._M_head_impl[1].padinfo_.width_ = 0;
    local_30._M_head_impl[1].padinfo_.side_ = left;
    local_30._M_head_impl[1].padinfo_.truncate_ = false;
    local_30._M_head_impl[1].padinfo_.enabled_ = false;
    *(undefined2 *)&local_30._M_head_impl[1].padinfo_.field_0xe = 0;
    local_30._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__aggregate_formatter_0019e4f0
    ;
    cVar5 = (char)local_30._M_head_impl + '\x18';
    local_30._M_head_impl[1]._vptr_flag_formatter =
         (_func_int **)&local_30._M_head_impl[1].padinfo_.side_;
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    local_28._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_28);
    if (local_28._M_head_impl != (flag_formatter *)0x0) {
      (*(local_28._M_head_impl)->_vptr_flag_formatter[1])();
    }
    if ((aggregate_formatter *)local_30._M_head_impl == (aggregate_formatter *)0x0) {
      return;
    }
    bwt::std::default_delete<spdlog::details::aggregate_formatter>::operator()
              ((default_delete<spdlog::details::aggregate_formatter> *)&local_30,
               (aggregate_formatter *)local_30._M_head_impl);
    return;
  case 0x23:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d9b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x24:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d8b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x25:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x20);
    ((local_30._M_head_impl)->padinfo_).width_ = 0;
    *(undefined8 *)((long)&((local_30._M_head_impl)->padinfo_).width_ + 6) = 0;
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019da30;
    *(undefined1 *)&local_30._M_head_impl[1]._vptr_flag_formatter = 0x25;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x2b:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x140);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__full_formatter_0019cd30;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    local_30._M_head_impl[2]._vptr_flag_formatter = (_func_int **)0x0;
    local_30._M_head_impl[1].padinfo_.width_ = (size_t)&PTR_grow_0019cd80;
    *(pad_side **)&local_30._M_head_impl[1].padinfo_.side_ =
         &local_30._M_head_impl[2].padinfo_.side_;
    local_30._M_head_impl[2].padinfo_.width_ = 0xfa;
    local_28._M_head_impl = (flag_formatter *)0x0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    if (local_30._M_head_impl == (flag_formatter *)0x0) {
      return;
    }
    (*(local_30._M_head_impl)->_vptr_flag_formatter[1])();
    local_30._M_head_impl = (flag_formatter *)0x0;
    if ((full_formatter *)local_28._M_head_impl == (full_formatter *)0x0) {
      return;
    }
    bwt::std::default_delete<spdlog::details::full_formatter>::operator()
              ((default_delete<spdlog::details::full_formatter> *)&local_28,
               (full_formatter *)local_28._M_head_impl);
    return;
  case 0x40:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d8f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x41:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d2b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x42:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d330;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x43:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d3b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x44:
  case 0x78:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d430;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x45:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d6b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x46:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d670;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x48:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d4f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x49:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d530;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x4c:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d000;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x4d:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d570;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x4f:
    pfVar1 = (flag_formatter *)operator_new(0x20);
    (pfVar1->padinfo_).width_ = sVar4;
    (pfVar1->padinfo_).side_ = (int)uVar3;
    (pfVar1->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    (pfVar1->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&(pfVar1->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    pfVar1->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019db30;
    pp_Var2 = (_func_int **)std::chrono::_V2::system_clock::now();
    pfVar1[1]._vptr_flag_formatter = pp_Var2;
    local_30._M_head_impl = pfVar1;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x50:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d830;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x52:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d770;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x53:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d5b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x54:
  case 0x58:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d7b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x59:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d3f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x5e:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d870;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x61:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d270;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x62:
  case 0x68:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d2f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 99:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d370;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 100:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d4b0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x65:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d5f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x66:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d630;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x67:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d970;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x69:
    pfVar1 = (flag_formatter *)operator_new(0x20);
    (pfVar1->padinfo_).width_ = sVar4;
    (pfVar1->padinfo_).side_ = (int)uVar3;
    (pfVar1->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    (pfVar1->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&(pfVar1->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    pfVar1->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019dab0;
    pp_Var2 = (_func_int **)std::chrono::_V2::system_clock::now();
    pfVar1[1]._vptr_flag_formatter = pp_Var2;
    local_30._M_head_impl = pfVar1;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6c:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019cfc0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6d:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d470;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6e:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019cf80;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x6f:
    pfVar1 = (flag_formatter *)operator_new(0x20);
    (pfVar1->padinfo_).width_ = sVar4;
    (pfVar1->padinfo_).side_ = (int)uVar3;
    (pfVar1->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    (pfVar1->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&(pfVar1->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    pfVar1->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019daf0;
    pp_Var2 = (_func_int **)std::chrono::_V2::system_clock::now();
    pfVar1[1]._vptr_flag_formatter = pp_Var2;
    local_30._M_head_impl = pfVar1;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x70:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d6f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x72:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d730;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x73:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d930;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x74:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d1f0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x75:
    pfVar1 = (flag_formatter *)operator_new(0x20);
    (pfVar1->padinfo_).width_ = sVar4;
    (pfVar1->padinfo_).side_ = (int)uVar3;
    (pfVar1->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    (pfVar1->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&(pfVar1->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    pfVar1->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019da70;
    pp_Var2 = (_func_int **)std::chrono::_V2::system_clock::now();
    pfVar1[1]._vptr_flag_formatter = pp_Var2;
    local_30._M_head_impl = pfVar1;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x76:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x18);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d230;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
    break;
  case 0x7a:
    local_30._M_head_impl = (flag_formatter *)operator_new(0x28);
    ((local_30._M_head_impl)->padinfo_).width_ = sVar4;
    ((local_30._M_head_impl)->padinfo_).side_ = (int)uVar3;
    ((local_30._M_head_impl)->padinfo_).truncate_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ((local_30._M_head_impl)->padinfo_).enabled_ = (bool)(char)((ulong)uVar3 >> 0x28);
    *(short *)&((local_30._M_head_impl)->padinfo_).field_0xe = (short)((ulong)uVar3 >> 0x30);
    (local_30._M_head_impl)->_vptr_flag_formatter = (_func_int **)&PTR__flag_formatter_0019d7f0;
    local_30._M_head_impl[1]._vptr_flag_formatter = (_func_int **)0x0;
    *(undefined4 *)&local_30._M_head_impl[1].padinfo_.width_ = 0;
    std::
    vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
    ::
    emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
              ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                *)&this->formatters_,
               (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                *)&local_30);
  }
  if (local_30._M_head_impl != (flag_formatter *)0x0) {
    (*(local_30._M_head_impl)->_vptr_flag_formatter[1])();
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::handle_flag_(char flag, details::padding_info padding)
{
    switch (flag)
    {

    case ('+'): // default formatter
        formatters_.push_back(details::make_unique<details::full_formatter>(padding));
        break;

    case 'n': // logger name
        formatters_.push_back(details::make_unique<details::name_formatter<Padder>>(padding));
        break;

    case 'l': // level
        formatters_.push_back(details::make_unique<details::level_formatter<Padder>>(padding));
        break;

    case 'L': // short level
        formatters_.push_back(details::make_unique<details::short_level_formatter<Padder>>(padding));
        break;

    case ('t'): // thread id
        formatters_.push_back(details::make_unique<details::t_formatter<Padder>>(padding));
        break;

    case ('v'): // the message text
        formatters_.push_back(details::make_unique<details::v_formatter<Padder>>(padding));
        break;

    case ('a'): // weekday
        formatters_.push_back(details::make_unique<details::a_formatter<Padder>>(padding));
        break;

    case ('A'): // short weekday
        formatters_.push_back(details::make_unique<details::A_formatter<Padder>>(padding));
        break;

    case ('b'):
    case ('h'): // month
        formatters_.push_back(details::make_unique<details::b_formatter<Padder>>(padding));
        break;

    case ('B'): // short month
        formatters_.push_back(details::make_unique<details::B_formatter<Padder>>(padding));
        break;

    case ('c'): // datetime
        formatters_.push_back(details::make_unique<details::c_formatter<Padder>>(padding));
        break;

    case ('C'): // year 2 digits
        formatters_.push_back(details::make_unique<details::C_formatter<Padder>>(padding));
        break;

    case ('Y'): // year 4 digits
        formatters_.push_back(details::make_unique<details::Y_formatter<Padder>>(padding));
        break;

    case ('D'):
    case ('x'): // datetime MM/DD/YY
        formatters_.push_back(details::make_unique<details::D_formatter<Padder>>(padding));
        break;

    case ('m'): // month 1-12
        formatters_.push_back(details::make_unique<details::m_formatter<Padder>>(padding));
        break;

    case ('d'): // day of month 1-31
        formatters_.push_back(details::make_unique<details::d_formatter<Padder>>(padding));
        break;

    case ('H'): // hours 24
        formatters_.push_back(details::make_unique<details::H_formatter<Padder>>(padding));
        break;

    case ('I'): // hours 12
        formatters_.push_back(details::make_unique<details::I_formatter<Padder>>(padding));
        break;

    case ('M'): // minutes
        formatters_.push_back(details::make_unique<details::M_formatter<Padder>>(padding));
        break;

    case ('S'): // seconds
        formatters_.push_back(details::make_unique<details::S_formatter<Padder>>(padding));
        break;

    case ('e'): // milliseconds
        formatters_.push_back(details::make_unique<details::e_formatter<Padder>>(padding));
        break;

    case ('f'): // microseconds
        formatters_.push_back(details::make_unique<details::f_formatter<Padder>>(padding));
        break;

    case ('F'): // nanoseconds
        formatters_.push_back(details::make_unique<details::F_formatter<Padder>>(padding));
        break;

    case ('E'): // seconds since epoch
        formatters_.push_back(details::make_unique<details::E_formatter<Padder>>(padding));
        break;

    case ('p'): // am/pm
        formatters_.push_back(details::make_unique<details::p_formatter<Padder>>(padding));
        break;

    case ('r'): // 12 hour clock 02:55:02 pm
        formatters_.push_back(details::make_unique<details::r_formatter<Padder>>(padding));
        break;

    case ('R'): // 24-hour HH:MM time
        formatters_.push_back(details::make_unique<details::R_formatter<Padder>>(padding));
        break;

    case ('T'):
    case ('X'): // ISO 8601 time format (HH:MM:SS)
        formatters_.push_back(details::make_unique<details::T_formatter<Padder>>(padding));
        break;

    case ('z'): // timezone
        formatters_.push_back(details::make_unique<details::z_formatter<Padder>>(padding));
        break;

    case ('P'): // pid
        formatters_.push_back(details::make_unique<details::pid_formatter<Padder>>(padding));
        break;

    case ('^'): // color range start
        formatters_.push_back(details::make_unique<details::color_start_formatter>(padding));
        break;

    case ('$'): // color range end
        formatters_.push_back(details::make_unique<details::color_stop_formatter>(padding));
        break;

    case ('@'): // source location (filename:filenumber)
        formatters_.push_back(details::make_unique<details::source_location_formatter<Padder>>(padding));
        break;

    case ('s'): // short source filename - without directory name
        formatters_.push_back(details::make_unique<details::short_filename_formatter<Padder>>(padding));
        break;

    case ('g'): // full source filename
        formatters_.push_back(details::make_unique<details::source_filename_formatter<Padder>>(padding));
        break;

    case ('#'): // source line number
        formatters_.push_back(details::make_unique<details::source_linenum_formatter<Padder>>(padding));
        break;

    case ('!'): // source funcname
        formatters_.push_back(details::make_unique<details::source_funcname_formatter<Padder>>(padding));
        break;

    case ('%'): // % char
        formatters_.push_back(details::make_unique<details::ch_formatter>('%'));
        break;

    case ('u'): // elapsed time since last log message in nanos
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::nanoseconds>>(padding));
        break;

    case ('i'): // elapsed time since last log message in micros
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::microseconds>>(padding));
        break;

    case ('o'): // elapsed time since last log message in millis
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::milliseconds>>(padding));
        break;

    case ('O'): // elapsed time since last log message in seconds
        formatters_.push_back(details::make_unique<details::elapsed_formatter<Padder, std::chrono::seconds>>(padding));
        break;

    default: // Unknown flag appears as is
        auto unknown_flag = details::make_unique<details::aggregate_formatter>();
        unknown_flag->add_ch('%');
        unknown_flag->add_ch(flag);
        formatters_.push_back((std::move(unknown_flag)));
        break;
    }
}